

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O2

void __thiscall
HalosExchange::HalosExchange
          (HalosExchange *this,int rank,int n_processes,int n_partners,int message_size)

{
  ulong uVar1;
  int iVar2;
  int *partners;
  ostream *poVar3;
  double **ppdVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  (this->super_Computation)._vptr_Computation = (_func_int **)&PTR__HalosExchange_00107c38;
  this->sbuf = (double *)0x0;
  this->reqs = (MPI_Request *)0x0;
  this->rank = rank;
  this->n_partners = n_partners;
  uVar1 = 0xffffffffffffffff;
  uVar6 = (long)n_partners * 4;
  if (n_partners < 0) {
    uVar6 = uVar1;
  }
  partners = (int *)operator_new__(uVar6);
  this->partners = partners;
  iVar2 = find_partners(rank,n_processes,n_partners,partners);
  if (iVar2 != 0) {
    MPI_Abort(&ompi_mpi_comm_world,1);
  }
  if ((message_size & 7U) != 0) {
    if (rank == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Message size must be a multiple of ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
      std::operator<<(poVar3,"\n");
    }
    MPI_Abort(&ompi_mpi_comm_world,1);
  }
  uVar7 = 0;
  uVar6 = (long)n_partners * 8;
  if (n_partners < 0) {
    uVar6 = uVar1;
  }
  uVar8 = (ulong)(uint)n_partners;
  if (n_partners < 1) {
    uVar8 = 0;
  }
  this->n_elements = (int)((long)message_size / 8);
  ppdVar4 = (double **)operator_new__(uVar6);
  this->rbuf = ppdVar4;
  uVar6 = ((long)message_size / 8 & 0xffffffffU) << 3;
  if (message_size < -7) {
    uVar6 = uVar1;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    pdVar5 = (double *)operator_new__(uVar6);
    this->rbuf[uVar7] = pdVar5;
  }
  return;
}

Assistant:

HalosExchange(int rank, int n_processes, int n_partners, int message_size)
    {
        this->rank = rank;
        this->n_partners = n_partners;
        this->partners = new int[n_partners];
        int failed = find_partners(rank, n_processes, n_partners, partners);
        if (failed) MPI_Abort(MPI_COMM_WORLD, 1);
        int sod = sizeof(double);
        if (message_size % sod != 0)
        {
            if (rank == 0)
                std::cerr << "Message size must be a multiple of " << sod << "\n";
            MPI_Abort(MPI_COMM_WORLD, 1);
        }
        this->n_elements = message_size / sod;
        this->rbuf = new double*[n_partners];
        for (int i = 0; i < n_partners; i++)
            rbuf[i] = new double[n_elements];
    }